

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Tag> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Tag,wabt::interp::Store&,wabt::interp::TagType&>
          (RefPtr<wabt::interp::Tag> *__return_storage_ptr__,Store *this,Store *args,TagType *args_1
          )

{
  Tag *pTVar1;
  Index index;
  TagType local_60;
  Tag *local_38;
  Ref local_30;
  Ref ref;
  TagType *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::Tag> *ptr;
  
  ref.index = (size_t)args_1;
  pTVar1 = (Tag *)operator_new(0x68);
  TagType::TagType(&local_60,(TagType *)ref.index);
  Tag::Tag(pTVar1,args,&local_60);
  local_38 = pTVar1;
  index = FreeList<wabt::interp::Object*>::New<wabt::interp::Tag*>
                    ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  Ref::Ref(&local_30,index);
  TagType::~TagType(&local_60);
  RefPtr<wabt::interp::Tag>::RefPtr(__return_storage_ptr__,this,local_30);
  pTVar1 = RefPtr<wabt::interp::Tag>::operator->(__return_storage_ptr__);
  (pTVar1->super_Extern).super_Object.self_.index = local_30.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}